

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pbVar1;
  bool bVar2;
  uint uVar3;
  file_time_type fVar4;
  istream *piVar5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  int iVar8;
  long lVar9;
  uint32_t lineno;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileName;
  pointer __source;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  thread local_240;
  ifstream configFile;
  
  bVar2 = CommandLineOptions::parse(&g_Options,argc,argv);
  if (bVar2) {
    if (g_Options.platform < 4) {
      std::__cxx11::string::assign((char *)&g_PlatformName_abi_cxx11_);
    }
    pbVar1 = g_Options.ignoreFileNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__source = g_Options.ignoreFileNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __source != pbVar1;
        __source = __source + 1) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&configFile,__source,auto_format);
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      emplace_back<std::filesystem::__cxx11::path>(&g_IgnoreIncludes_abi_cxx11_,(path *)&configFile)
      ;
      std::filesystem::__cxx11::path::~path((path *)&configFile);
    }
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&configFile,&g_Options.inputFile,auto_format);
    g_ConfigWriteTime.__d.__r = (duration)std::filesystem::last_write_time((path *)&configFile);
    std::filesystem::__cxx11::path::~path((path *)&configFile);
    std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
              ((path *)&configFile,argv,auto_format);
    fVar4.__d.__r = (duration)std::filesystem::last_write_time((path *)&configFile);
    if ((long)fVar4.__d.__r < (long)g_ConfigWriteTime.__d.__r) {
      fVar4 = g_ConfigWriteTime;
    }
    g_ConfigWriteTime.__d.__r = fVar4.__d.__r;
    std::filesystem::__cxx11::path::~path((path *)&configFile);
    std::ifstream::ifstream(&configFile,(string *)&g_Options,_S_in);
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    iVar8 = 1;
    lineno = 1;
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&configFile,(string *)&threads);
      uVar3 = *(uint *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18) + 0x20);
      if ((uVar3 & 5) != 0) break;
      bVar2 = trim((string *)&threads);
      if ((bVar2) && (bVar2 = expandPermutations(lineno,(string *)&threads), !bVar2))
      goto LAB_0010a108;
      lineno = lineno + 1;
    }
    iVar8 = 0;
LAB_0010a108:
    std::__cxx11::string::~string((string *)&threads);
    if ((uVar3 & 5) != 0) {
      if (g_CompileTasks.super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl.
          super__Vector_impl_data._M_start ==
          g_CompileTasks.super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        poVar6 = std::operator<<((ostream *)&std::cout,"All ");
        poVar6 = std::operator<<(poVar6,(string *)&g_PlatformName_abi_cxx11_);
        poVar6 = std::operator<<(poVar6," outputs are up to date.");
        iVar8 = 0;
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      else {
        g_OriginalTaskCount =
             (int)(((long)g_CompileTasks.
                          super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)g_CompileTasks.
                         super__Vector_base<CompileTask,_std::allocator<CompileTask>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0xa0);
        LOCK();
        g_ProcessedTaskCount.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
        UNLOCK();
        snprintf(main::envBuf,0x400,"COMPILER=%s",g_Options.compilerPath._M_dataplus._M_p);
        putenv(main::envBuf);
        if (g_Options.verbose == true) {
          poVar6 = std::operator<<((ostream *)&std::cout,main::envBuf);
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        uVar3 = std::thread::hardware_concurrency();
        if ((uVar3 == 0) || (g_Options.parallel == false)) {
          uVar3 = 1;
        }
        signal(2,signal_handler);
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<std::thread,_std::allocator<std::thread>_>::resize(&threads,(ulong)uVar3);
        lVar9 = (ulong)uVar3 << 3;
        for (lVar10 = 0; lVar9 != lVar10; lVar10 = lVar10 + 8) {
          std::thread::thread<void(&)(),,void>(&local_240,compileThreadProc);
          std::thread::operator=
                    ((thread *)
                     ((long)&((threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread + lVar10
                     ),&local_240);
          std::thread::~thread(&local_240);
        }
        for (lVar10 = 0; lVar9 != lVar10; lVar10 = lVar10 + 8) {
          std::thread::join();
        }
        iVar8 = 1;
        if ((g_CompileSuccess != false) &&
           (p_Var7 = g_ShaderBlobs_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
           g_Terminate == false)) {
          for (; (_Rb_tree_header *)p_Var7 !=
                 &g_ShaderBlobs_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
            bVar2 = WriteShaderBlob((string *)(p_Var7 + 1),
                                    (vector<BlobEntry,_std::allocator<BlobEntry>_> *)(p_Var7 + 2));
            if (!bVar2) goto LAB_0010a2b9;
          }
          iVar8 = 0;
        }
LAB_0010a2b9:
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
      }
    }
    std::ifstream::~ifstream(&configFile);
  }
  else {
    iVar8 = 1;
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)&g_Options.errorMessage);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  return iVar8;
}

Assistant:

int main(int argc, char** argv)
{
	if (!g_Options.parse(argc, argv))
	{
		cout << g_Options.errorMessage << endl;
		return 1;
	}

	switch (g_Options.platform)
	{
	case Platform::DXBC: g_PlatformName = "DXBC"; break;
	case Platform::DXIL: g_PlatformName = "DXIL"; break;
	case Platform::SPIRV: g_PlatformName = "SPIR-V"; break;
	case Platform::UNKNOWN: g_PlatformName = "UNKNOWN"; break; // never happens
	}

	for (const auto& fileName : g_Options.ignoreFileNames)
	{
		g_IgnoreIncludes.push_back(fileName);
	}
	
	g_ConfigWriteTime = fs::last_write_time(g_Options.inputFile);

	// Updated shaderCompiler executable also means everything must be recompiled
	g_ConfigWriteTime = std::max(g_ConfigWriteTime, fs::last_write_time(argv[0]));
	
	ifstream configFile(g_Options.inputFile);
	uint32_t lineno = 0;
	for(string line; getline(configFile, line);)
	{
		lineno++;

		if (!trim(line))
			continue;

		if (!expandPermutations(lineno, line))
			return 1;
	}

	if (g_CompileTasks.empty())
	{
		cout << "All " << g_PlatformName << " outputs are up to date." << endl;
		return 0;
	}

	g_OriginalTaskCount = (int)g_CompileTasks.size();
	g_ProcessedTaskCount = 0;

	{
		// Workaround for weird behavior of _popen / cmd.exe on Windows
		// with quotes around the executable name and also around some other arguments.

		static char envBuf[1024]; // use a static array because putenv uses it by reference
#ifdef WIN32
		snprintf(envBuf, sizeof(envBuf), "COMPILER=\"%s\"", g_Options.compilerPath.c_str());
#else
		snprintf(envBuf, sizeof(envBuf), "COMPILER=%s", g_Options.compilerPath.c_str());
#endif
		putenv(envBuf);
		
		if (g_Options.verbose)
		{
			cout << envBuf << endl;
		}
	}

	unsigned int threadCount = thread::hardware_concurrency();
	if (threadCount == 0 || !g_Options.parallel)
	{
		threadCount = 1;
	}

	signal(SIGINT, signal_handler);

	vector<thread> threads;
	threads.resize(threadCount);
	for (unsigned int threadIndex = 0; threadIndex < threadCount; threadIndex++)
	{
		threads[threadIndex] = thread(compileThreadProc);
	}
	for (unsigned int threadIndex = 0; threadIndex < threadCount; threadIndex++)
	{
		threads[threadIndex].join();
	}

	if (!g_CompileSuccess || g_Terminate)
		return 1;

	for (const pair<const string, vector<BlobEntry>>& it : g_ShaderBlobs)
	{
		if (!WriteShaderBlob(it.first, it.second))
			return 1;
	}

	return 0;
}